

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator_tests.cpp
# Opt level: O2

void apply_constant<ear::dsp::LinearInterpSingle,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>,float>
               (VectorBlock<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *in,
               VectorBlock<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *out,float *point)

{
  PtrAdapter out_p;
  PtrAdapter in_p;
  
  ear::dsp::PtrAdapterT<float_*>::PtrAdapterT((PtrAdapterT<float_*> *)&in_p,1);
  ear::dsp::PtrAdapterT<float*>::set_eigen<Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>&>
            ((PtrAdapterT<float*> *)&in_p,in,0);
  ear::dsp::PtrAdapterT<float_*>::PtrAdapterT(&out_p,1);
  ear::dsp::PtrAdapterT<float*>::set_eigen<Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>&>
            ((PtrAdapterT<float*> *)&out_p,out,0);
  ear::dsp::LinearInterpSingle::apply_constant
            (in_p._ptrs.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             out_p._ptrs.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
             super__Vector_impl_data._M_start,0,
             (in->super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>).
             super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
             m_rows.m_value,point);
  std::_Vector_base<float_*,_std::allocator<float_*>_>::~_Vector_base
            ((_Vector_base<float_*,_std::allocator<float_*>_> *)&out_p);
  std::_Vector_base<float_*,_std::allocator<float_*>_>::~_Vector_base
            ((_Vector_base<float_*,_std::allocator<float_*>_> *)&in_p);
  return;
}

Assistant:

void apply_constant(In &&in, Out &&out, const Point &point) {
  PtrAdapter in_p(in.cols());
  in_p.set_eigen(in);
  PtrAdapter out_p(out.cols());
  out_p.set_eigen(out);

  Interp::apply_constant(in_p.ptrs(), out_p.ptrs(), 0, (SampleIndex)in.rows(),
                         point);
}